

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O3

void ABC_SolveInit(ABC_Manager mng)

{
  Abc_Ntk_t *pAVar1;
  
  if (mng->nog != mng->vNodes->nSize) {
    __assert_fail("mng->nog == Vec_PtrSize(mng->vNodes)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                  ,0x23d,"void ABC_SolveInit(ABC_Manager)");
  }
  if (mng->nog != 0) {
    if (mng->pTarget != (Abc_Ntk_t *)0x0) {
      Abc_NtkDelete(mng->pTarget);
    }
    pAVar1 = Abc_NtkStrash(mng->pNtk,0,1,0);
    mng->pTarget = pAVar1;
    return;
  }
  puts("ABC_SolveInit: Target is not specified by ABC_AddTarget().");
  return;
}

Assistant:

void ABC_SolveInit( ABC_Manager mng )
{
    // check if the target is available
    assert( mng->nog == Vec_PtrSize(mng->vNodes) );
    if ( mng->nog == 0 )
        { printf( "ABC_SolveInit: Target is not specified by ABC_AddTarget().\n" ); return; }

    // free the previous target network if present
    if ( mng->pTarget ) Abc_NtkDelete( mng->pTarget );

    // set the new target network
//    mng->pTarget = Abc_NtkCreateTarget( mng->pNtk, mng->vNodes, mng->vValues );
    mng->pTarget = Abc_NtkStrash( mng->pNtk, 0, 1, 0 );
}